

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::update_download_rate(session_impl *this)

{
  mutex *pmVar1;
  int iVar2;
  peer_class_t c;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_30;
  
  pmVar1 = &(this->m_settings).m_mutex;
  local_30._M_owns = false;
  local_30._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  iVar2 = (this->m_settings).m_store.m_ints._M_elems[0x4f];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (iVar2 < 0) {
    local_30._M_owns = false;
    local_30._M_device = pmVar1;
    ::std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    (this->m_settings).m_store.m_ints._M_elems[0x4f] = 0;
    ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  c.m_val = (this->m_global_class).m_val;
  local_30._M_owns = false;
  local_30._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  iVar2 = (this->m_settings).m_store.m_ints._M_elems[0x4f];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
  set_rate_limit(this,c,1,iVar2);
  return;
}

Assistant:

void session_impl::update_download_rate()
	{
		if (m_settings.get_int(settings_pack::download_rate_limit) < 0)
			m_settings.set_int(settings_pack::download_rate_limit, 0);
		set_download_rate_limit(m_global_class
			, m_settings.get_int(settings_pack::download_rate_limit));
	}